

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O2

void __thiscall
CVmObjIterIdx::restore_from_file
          (CVmObjIterIdx *this,vm_obj_id_t param_1,CVmFile *fp,CVmObjFixup *fixups)

{
  int iVar1;
  undefined4 extraout_var;
  
  if ((this->super_CVmObjIter).super_CVmObject.ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
    (this->super_CVmObjIter).super_CVmObject.ext_ = (char *)0x0;
  }
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x15,this);
  (this->super_CVmObjIter).super_CVmObject.ext_ = (char *)CONCAT44(extraout_var,iVar1);
  CVmFile::read_bytes(fp,(char *)CONCAT44(extraout_var,iVar1),0x15);
  CVmObjFixup::fix_dh(fixups,(this->super_CVmObjIter).super_CVmObject.ext_);
  return;
}

Assistant:

void CVmObjIterIdx::restore_from_file(VMG_ vm_obj_id_t,
                                      CVmFile *fp, CVmObjFixup *fixups)
{
    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* allocate a new extension */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(VMOBJITERIDX_EXT_SIZE, this);

    /* read my extension */
    fp->read_bytes(ext_, VMOBJITERIDX_EXT_SIZE);

    /* fix up my collection object reference */
    fixups->fix_dh(vmg_ ext_);
}